

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsenumber.cpp
# Opt level: O1

NumberType ICM::Parser::parseNumber(char *ptr,uint64_t *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  longdouble *plVar3;
  char *pcVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  NumberType NVar8;
  NumberType NVar9;
  size_t sVar10;
  byte *pbVar11;
  char *pcVar12;
  byte *pbVar13;
  byte *__s;
  size_t len;
  size_t len_00;
  Format format;
  longdouble lVar14;
  int64_t result2;
  charptr cp;
  charptr front_1;
  string local_c0;
  longdouble *local_a0;
  uint64_t local_98;
  float local_90;
  float local_8c;
  string local_88;
  charptr local_68;
  double local_48;
  double local_40;
  uint64_t local_38;
  
  if (*ptr == '-') {
    ptr = ptr + 1;
    bVar6 = true;
  }
  else {
    if (*ptr == '+') {
      ptr = ptr + 1;
    }
    bVar6 = false;
  }
  format = f_dec;
  bVar7 = true;
  local_a0 = (longdouble *)value;
  if (*ptr == '0') {
    bVar2 = ptr[1];
    if (99 < bVar2) {
      if (bVar2 != 100) {
        if (bVar2 == 0x6f) {
          format = f_oct;
        }
        else {
          if (bVar2 != 0x78) {
            return nt_unknown;
          }
          format = f_hex;
        }
        goto LAB_0012df7f;
      }
      ptr = ptr + 2;
      goto LAB_0012df81;
    }
    if (bVar2 != 0x2e) {
      if (bVar2 != 0x62) {
        return nt_unknown;
      }
      format = f_bin;
LAB_0012df7f:
      ptr = ptr + 2;
      bVar7 = false;
      goto LAB_0012df81;
    }
    pcVar4 = ptr + 2;
    do {
      pcVar12 = pcVar4;
      bVar7 = judgeCharNumber(*pcVar12,10);
      pcVar4 = pcVar12 + 1;
    } while (bVar7);
    if (*pcVar12 != '\0') {
      return nt_unknown;
    }
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    sVar10 = strlen(ptr);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,ptr,ptr + sVar10);
    NVar9 = parseFloat(&local_c0,value,bVar6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p == &local_c0.field_2) {
      return NVar9;
    }
LAB_0012e2b4:
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  else {
LAB_0012df81:
    bVar5 = judgeCharNumber(*ptr,format);
    if (!bVar5) {
      return nt_unknown;
    }
    len_00 = 0;
    do {
      len = len_00;
      bVar5 = judgeCharNumber(ptr[len],format);
      len_00 = len + 1;
    } while (bVar5);
    __s = (byte *)(ptr + len_00);
    bVar2 = ptr[len];
    if (bVar2 < 0x65) {
      if (bVar2 == 0) {
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        sVar10 = strlen(ptr);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,ptr,ptr + sVar10);
        NVar9 = parseInteger(&local_c0,(uint64_t *)local_a0,bVar6,format);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p == &local_c0.field_2) {
          return NVar9;
        }
        goto LAB_0012e2b4;
      }
      if (bVar2 != 0x2e) {
        if (bVar2 != 0x45) {
          return nt_unknown;
        }
        goto LAB_0012e03c;
      }
      Common::charptr::charptr(&local_68,ptr,len_00);
      pbVar11 = __s;
      do {
        pbVar13 = pbVar11;
        bVar7 = judgeCharNumber(*pbVar13,format);
        plVar3 = local_a0;
        pbVar11 = pbVar13 + 1;
      } while (bVar7);
      NVar9 = nt_unknown;
      if (*pbVar13 == 0) {
        std::__cxx11::string::string
                  ((string *)&local_c0,
                   (char *)CONCAT62(local_68._data.
                                    super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                                    _2_6_,local_68._data.
                                          super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>.
                                          _M_ptr._0_2_),(allocator *)&local_88);
        std::__cxx11::string::string((string *)&local_88,(char *)__s,(allocator *)&local_98);
        NVar9 = parseFloat(&local_c0,&local_88,(uint64_t *)plVar3,bVar6,format);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,
                          (ulong)(local_88.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
      }
    }
    else if (bVar2 == 0x65) {
LAB_0012e03c:
      if (!bVar7) {
        return nt_unknown;
      }
      NVar9 = (NumberType)*__s;
      if (*__s == 0) {
        return NVar9;
      }
      if ((NVar9 == 0x2b) || (NVar9 == 0x2d)) {
        __s = (byte *)(ptr + len + 2);
      }
      pbVar11 = __s + ~(ulong)ptr;
      do {
        pbVar13 = __s;
        bVar2 = *pbVar13;
        __s = pbVar13 + 1;
        pbVar11 = pbVar11 + 1;
      } while ((int)(char)bVar2 - 0x30U < 10);
      if (bVar2 == 0) {
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        sVar10 = strlen(ptr);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,ptr,ptr + sVar10);
        NVar9 = parseFloat(&local_c0,(uint64_t *)local_a0,bVar6);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p == &local_c0.field_2) {
          return NVar9;
        }
        goto LAB_0012e2b4;
      }
      if ((bVar2 != 0x2d) && (bVar2 != 0x2b)) {
        return nt_unknown;
      }
      Common::charptr::charptr((charptr *)&local_88,ptr,(size_t)pbVar11);
      std::__cxx11::string::string
                ((string *)&local_c0,(char *)local_88._M_string_length,(allocator *)&local_98);
      parseFloat(&local_c0,&local_68._capacity,bVar6);
      plVar3 = local_a0;
      paVar1 = &local_c0.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != paVar1) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      local_68._data.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88.field_2._M_allocated_capacity;
      NVar9 = nt_unknown;
      if ((int)(char)*__s - 0x30U < 10) {
        bVar2 = *pbVar13;
        pbVar11 = __s;
        do {
          pbVar13 = pbVar11;
          bVar6 = judgeCharNumber(*pbVar13,10);
          pbVar11 = pbVar13 + 1;
        } while (bVar6);
        local_68._data.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88.field_2._M_allocated_capacity;
        if (*pbVar13 == 0) {
          local_c0._M_dataplus._M_p = (pointer)paVar1;
          sVar10 = strlen((char *)__s);
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,__s,__s + sVar10);
          parseInteger(&local_c0,&local_98,bVar2 == 0x2d,f_dec);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != paVar1) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
          local_38 = local_98;
          lVar14 = (longdouble)(long)local_98 +
                   (longdouble)
                   CONCAT28(local_68._data.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr._0_2_,local_68._capacity);
          *plVar3 = lVar14;
          local_90 = (float)lVar14;
          local_48 = (double)lVar14;
          NVar8 = lVar14 == (longdouble)local_48 ^ nt_ldouble;
          NVar9 = nt_float;
          if (lVar14 != (longdouble)local_90) {
            NVar9 = NVar8;
          }
          local_68._data.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_88.field_2._M_allocated_capacity;
          local_8c = local_90;
          local_40 = local_48;
          if (NAN(lVar14) || NAN((longdouble)local_90)) {
            NVar9 = NVar8;
          }
        }
      }
    }
    else {
      if ((bVar2 != 0x69) && (bVar2 != 0x75)) {
        return nt_unknown;
      }
      Common::charptr::charptr((charptr *)&local_88,ptr,len);
      plVar3 = local_a0;
      if (ptr[len] == 'i') {
        std::__cxx11::string::string
                  ((string *)&local_c0,(char *)local_88._M_string_length,(allocator *)&local_68);
        NVar9 = parseInteger(&local_c0,(uint64_t *)local_a0,bVar6,format);
      }
      else {
        local_68._data.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88.field_2._M_allocated_capacity;
        NVar9 = nt_unknown;
        if (bVar6 != false) goto LAB_0012e3d2;
        std::__cxx11::string::string
                  ((string *)&local_c0,(char *)local_88._M_string_length,(allocator *)&local_68);
        NVar9 = parseUnsigned(&local_c0,(uint64_t *)plVar3,format);
      }
      local_68._data.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88.field_2._M_allocated_capacity;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        local_68._data.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88.field_2._M_allocated_capacity;
      }
    }
LAB_0012e3d2:
    if (local_68._data.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68._data.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
  }
  return NVar9;
}

Assistant:

NumberType parseNumber(const char *ptr, uint64_t &value)
		{
			bool minus = false;

			Format format = f_dec;

			if (*ptr == '+') {
				ptr++;
			}
			else if (*ptr == '-') {
				minus = true;
				ptr++;
			}

			if (*ptr == '0') {
				ptr++;
				switch (*ptr) {
				case 'b': format = f_bin; ptr++; break;
				case 'o': format = f_oct; ptr++; break;
				case 'd': format = f_dec; ptr++; break;
				case 'x': format = f_hex; ptr++; break;
				case '.':
					// Include : 0. -> 0.0
					return checkBehindNumber(ptr + 1, format) ? parseFloat(ptr - 1, value, minus) : nt_unknown;
				default: return nt_unknown;
				}
			}

			if (!judgeCharNumber(*ptr, format))
				return nt_unknown;

			const char *end;
			if (checkBehindNumber(ptr, format, &end)) {
				return parseInteger(ptr, value, minus, format);
			}
			else {
				if (*end == 'i' || *end == 'u') {
					charptr cp(ptr, end);

					if (*end == 'i') {
						return parseInteger(cp.to_string(), value, minus, format);
					}
					else {
						if (minus) return nt_unknown;

						return parseUnsigned(cp.to_string(), value, format);
					}
				}

				if (*end == '.') {
					end++;
					charptr front(ptr, end);
					ptr = end;

					// Include the number : XXX. -> XXX.0
					if (*ptr == '\0') (void)0;

					if (!checkBehindNumber(ptr, format))
						return nt_unknown;

					return parseFloat(front.to_string(), ptr, value, minus, format);
				}

				if (*end == 'e' || *end == 'E') {
					if (format != f_dec)
						return nt_unknown;

					end++;
					if (*end == '\0')
						return nt_unknown;

					if (*end == '+' || *end == '-') {
						end++;
					}
					while (isdigit(*end)) {
						end++;
					}
					if (*end == '+' || *end == '-') {
						charptr front(ptr, end);
						long double result1;
						parseFloat(front.to_string(), (uint64_t&)result1, minus);

						minus = *end == '-';
						ptr = end + 1;
						if (!isdigit(*ptr))
							return nt_unknown;

						if (!checkBehindNumber(ptr, format))
							return nt_unknown;

						int64_t result2;
						parseInteger(ptr, (uint64_t&)result2, minus, f_dec);

						(long double&)value = result1 + (long double)result2;
						return getLimitTypeFloat(value);
					}
					if (*end != '\0')
						return nt_unknown;

					return parseFloat(ptr, value, minus);
				}
			}

			return nt_unknown;
		}